

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O2

void __thiscall WriteIncludesBase::acceptProperty(WriteIncludesBase *this,DomProperty *node)

{
  Kind KVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  KVar1 = node->m_kind;
  if (KVar1 == Date) {
    local_40.d = (Data *)0x0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_40.ptr = L"QDate";
    local_58.size = 0;
    local_40.size = 5;
    add(this,(QString *)&local_40,(DomCustomWidget *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    KVar1 = node->m_kind;
  }
  if (KVar1 == Locale) {
    local_40.d = (Data *)0x0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_40.ptr = L"QLocale";
    local_58.size = 0;
    local_40.size = 7;
    add(this,(QString *)&local_40,(DomCustomWidget *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    KVar1 = node->m_kind;
  }
  if (KVar1 == IconSet) {
    local_40.d = (Data *)0x0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_40.ptr = L"QIcon";
    local_58.size = 0;
    local_40.size = 5;
    add(this,(QString *)&local_40,(DomCustomWidget *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  TreeWalker::acceptProperty(&this->super_TreeWalker,node);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptProperty(DomProperty *node)
{
    if (node->kind() == DomProperty::Date)
        add(QStringLiteral("QDate"));
    if (node->kind() == DomProperty::Locale)
        add(QStringLiteral("QLocale"));
    if (node->kind() == DomProperty::IconSet)
        add(QStringLiteral("QIcon"));
    TreeWalker::acceptProperty(node);
}